

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O1

void P_SpawnPushers(void)

{
  uint uVar1;
  PClass *pPVar2;
  int iVar3;
  AActor *pAVar4;
  AActor **ppAVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DPusher *pDVar6;
  int iVar7;
  line_t_conflict *plVar8;
  AActor *source;
  line_t_conflict *plVar9;
  FSectorTagIterator itr;
  FSectorTagIterator local_40;
  AActor **local_38;
  
  if (0 < numlines) {
    iVar7 = 0;
    plVar9 = lines;
    do {
      iVar3 = plVar9->special;
      if (iVar3 == 0xe3) {
        iVar3 = plVar9->args[0];
        if (iVar3 == 0) {
          uVar1 = plVar9->args[1];
          local_38 = (AActor **)((long)AActor::TIDHash + (ulong)((uVar1 & 0x7f) << 3));
          pAVar4 = (AActor *)0x0;
LAB_0043e180:
          if (uVar1 == 0) {
            source = (AActor *)0x0;
          }
          else {
            ppAVar5 = &pAVar4->inext;
            if (pAVar4 == (AActor *)0x0) {
              ppAVar5 = local_38;
            }
            for (source = *ppAVar5;
                (pAVar4 = source, source != (AActor *)0x0 && (source->tid != uVar1));
                source = source->inext) {
            }
          }
          if (source != (AActor *)0x0) {
            if ((source->super_DThinker).super_DObject.Class == (PClass *)0x0) {
              iVar3 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
              (source->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
            }
            pPVar2 = (source->super_DThinker).super_DObject.Class;
            if ((pPVar2->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index != 0x3c)
            goto code_r0x0043e1f1;
            goto LAB_0043e213;
          }
        }
        else {
          local_40.start = tagManager.TagHashFirst[(byte)iVar3];
          local_40.searchtag = iVar3;
          iVar3 = FSectorTagIterator::Next(&local_40);
          while (-1 < iVar3) {
            pAVar4 = P_GetPushThing(iVar3);
            if ((pAVar4 != (AActor *)0x0) &&
               ((plVar9->args[1] == 0 || (plVar9->args[1] == pAVar4->tid)))) {
              pDVar6 = (DPusher *)
                       M_Malloc_Dbg(0x70,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                    ,0x1f9);
              plVar8 = (line_t_conflict *)0x0;
              if (plVar9->args[3] != 0) {
                plVar8 = plVar9;
              }
              DPusher::DPusher(pDVar6,p_push,(line_t *)plVar8,plVar9->args[2],0,pAVar4,iVar3);
            }
            iVar3 = FSectorTagIterator::Next(&local_40);
          }
        }
        plVar9->special = 0;
      }
      else {
        if (iVar3 == 0xdc) {
          local_40.searchtag = plVar9->args[0];
          if (local_40.searchtag == 0) {
            local_40.start = 0;
          }
          else {
            local_40.start = tagManager.TagHashFirst[(byte)local_40.searchtag];
          }
          while (iVar3 = FSectorTagIterator::Next(&local_40), -1 < iVar3) {
            pDVar6 = (DPusher *)
                     M_Malloc_Dbg(0x70,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
            plVar8 = plVar9;
            if (plVar9->args[3] == 0) {
              plVar8 = (line_t_conflict *)0x0;
            }
            DPusher::DPusher(pDVar6,p_current,(line_t *)plVar8,plVar9->args[1],plVar9->args[2],
                             (AActor *)0x0,iVar3);
          }
        }
        else {
          if (iVar3 != 0xda) goto LAB_0043e2d3;
          local_40.searchtag = plVar9->args[0];
          if (local_40.searchtag == 0) {
            local_40.start = 0;
          }
          else {
            local_40.start = tagManager.TagHashFirst[(byte)local_40.searchtag];
          }
          while (iVar3 = FSectorTagIterator::Next(&local_40), -1 < iVar3) {
            pDVar6 = (DPusher *)
                     M_Malloc_Dbg(0x70,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                  ,0x1f9);
            plVar8 = plVar9;
            if (plVar9->args[3] == 0) {
              plVar8 = (line_t_conflict *)0x0;
            }
            DPusher::DPusher(pDVar6,p_wind,(line_t *)plVar8,plVar9->args[1],plVar9->args[2],
                             (AActor *)0x0,iVar3);
          }
        }
        plVar9->special = 0;
      }
LAB_0043e2d3:
      iVar7 = iVar7 + 1;
      plVar9 = plVar9 + 1;
    } while (iVar7 < numlines);
  }
  return;
code_r0x0043e1f1:
  if (pPVar2 == (PClass *)0x0) {
    iVar3 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
    (source->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar3);
  }
  if ((((source->super_DThinker).super_DObject.Class)->super_PNativeStruct).super_PStruct.
      super_PNamedType.TypeName.Index == 0x3d) {
LAB_0043e213:
    pDVar6 = (DPusher *)
             M_Malloc_Dbg(0x70,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                          ,0x1f9);
    plVar8 = (line_t_conflict *)0x0;
    if (plVar9->args[3] != 0) {
      plVar8 = plVar9;
    }
    DPusher::DPusher(pDVar6,p_push,(line_t *)plVar8,plVar9->args[2],0,source,
                     (int)((ulong)((long)source->Sector - (long)sectors) >> 3) * 0x7a44c6b);
  }
  goto LAB_0043e180;
}

Assistant:

void P_SpawnPushers ()
{
	int i;
	line_t *l = lines;
	int s;

	for (i = 0; i < numlines; i++, l++)
	{
		switch (l->special)
		{
		case Sector_SetWind: // wind
		{
			FSectorTagIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
				new DPusher(DPusher::p_wind, l->args[3] ? l : NULL, l->args[1], l->args[2], NULL, s);
			l->special = 0;
			break;
		}

		case Sector_SetCurrent: // current
		{
			FSectorTagIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
				new DPusher(DPusher::p_current, l->args[3] ? l : NULL, l->args[1], l->args[2], NULL, s);
			l->special = 0;
			break;
		}

		case PointPush_SetForce: // push/pull
			if (l->args[0]) {	// [RH] Find thing by sector
				FSectorTagIterator itr(l->args[0]);
				while ((s = itr.Next()) >= 0)
				{
					AActor *thing = P_GetPushThing (s);
					if (thing) {	// No MT_P* means no effect
						// [RH] Allow narrowing it down by tid
						if (!l->args[1] || l->args[1] == thing->tid)
							new DPusher (DPusher::p_push, l->args[3] ? l : NULL, l->args[2],
										 0, thing, s);
					}
				}
			} else {	// [RH] Find thing by tid
				AActor *thing;
				FActorIterator iterator (l->args[1]);

				while ( (thing = iterator.Next ()) )
				{
					if (thing->GetClass()->TypeName == NAME_PointPusher ||
						thing->GetClass()->TypeName == NAME_PointPuller)
					{
						new DPusher (DPusher::p_push, l->args[3] ? l : NULL, l->args[2],
									 0, thing, int(thing->Sector - sectors));
					}
				}
			}
			l->special = 0;
			break;
		}
	}
}